

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O3

ggml_tensor * __thiscall
llm_build_rwkv6_base::build_rwkv6_channel_mix
          (llm_build_rwkv6_base *this,llama_layer *layer,ggml_tensor *cur,ggml_tensor *x_prev,
          llm_arch arch)

{
  ggml_context *pgVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  
  uVar2 = ggml_sub((this->super_llm_graph_context).ctx0,x_prev);
  if (arch == LLM_ARCH_RWKV6) {
    pgVar1 = (this->super_llm_graph_context).ctx0;
    uVar3 = ggml_mul(pgVar1,uVar2,layer->channel_mix_lerp_k);
    pgVar4 = (ggml_tensor *)ggml_add(pgVar1,uVar3,cur);
    pgVar1 = (this->super_llm_graph_context).ctx0;
    uVar2 = ggml_mul(pgVar1,uVar2,layer->channel_mix_lerp_r);
    pgVar5 = (ggml_tensor *)ggml_add(pgVar1,uVar2,cur);
    pgVar1 = (this->super_llm_graph_context).ctx0;
    pgVar5 = llm_graph_context::build_lora_mm
                       (&this->super_llm_graph_context,layer->channel_mix_receptance,pgVar5);
    uVar2 = ggml_sigmoid(pgVar1,pgVar5);
    pgVar1 = (this->super_llm_graph_context).ctx0;
    pgVar4 = llm_graph_context::build_lora_mm
                       (&this->super_llm_graph_context,layer->channel_mix_key,pgVar4);
    uVar3 = ggml_relu(pgVar1,pgVar4);
    pgVar4 = (ggml_tensor *)ggml_sqr(pgVar1,uVar3);
    pgVar1 = (this->super_llm_graph_context).ctx0;
    pgVar4 = llm_graph_context::build_lora_mm
                       (&this->super_llm_graph_context,layer->channel_mix_value,pgVar4);
    pgVar4 = (ggml_tensor *)ggml_mul(pgVar1,uVar2,pgVar4);
    return pgVar4;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
             ,0x2c85,"fatal error");
}

Assistant:

ggml_tensor * build_rwkv6_channel_mix(
            const llama_layer * layer,
            ggml_tensor * cur,
            ggml_tensor * x_prev,
            llm_arch arch) const {
        ggml_tensor * sx = ggml_sub(ctx0, x_prev, cur);
        switch (arch) {
            case LLM_ARCH_RWKV6:
                {
                    ggml_tensor * xk = ggml_add(ctx0, ggml_mul(ctx0, sx, layer->channel_mix_lerp_k), cur);
                    ggml_tensor * xr = ggml_add(ctx0, ggml_mul(ctx0, sx, layer->channel_mix_lerp_r), cur);

                    ggml_tensor * r = ggml_sigmoid(ctx0, build_lora_mm(layer->channel_mix_receptance, xr));
                    ggml_tensor * k = ggml_sqr(
                            ctx0,
                            ggml_relu(
                                ctx0,
                                build_lora_mm(layer->channel_mix_key, xk)
                                )
                            );
                    cur = ggml_mul(ctx0, r, build_lora_mm(layer->channel_mix_value, k));
                } break;
            default:
                GGML_ABORT("fatal error");
        }

        return cur;
    }